

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int mriStepInnerStepper_AllocVecs(MRIStepInnerStepper stepper,int count,N_Vector tmpl)

{
  int iVar1;
  N_Vector *pp_Var2;
  realtype *prVar3;
  sunindextype liw1;
  sunindextype lrw1;
  
  if (stepper == (MRIStepInnerStepper)0x0) {
    return -0x16;
  }
  if (tmpl->ops->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    lrw1 = 0;
    liw1 = 0;
  }
  else {
    N_VSpace(tmpl,&lrw1,&liw1);
  }
  stepper->lrw1 = lrw1;
  stepper->liw1 = liw1;
  stepper->nforcing = count;
  iVar1 = arkAllocVecArray(count,tmpl,&stepper->forcing,lrw1,&stepper->lrw,liw1,&stepper->liw);
  if (iVar1 != 0) {
    if (stepper->vecs == (N_Vector *)0x0) {
      pp_Var2 = (N_Vector *)calloc((long)(count + 1),8);
      stepper->vecs = pp_Var2;
      if (pp_Var2 == (N_Vector *)0x0) goto LAB_003bed42;
    }
    if (stepper->vals != (realtype *)0x0) {
      return 0;
    }
    prVar3 = (realtype *)calloc((long)(count + 1),8);
    stepper->vals = prVar3;
    if (prVar3 != (realtype *)0x0) {
      return 0;
    }
  }
LAB_003bed42:
  mriStepInnerStepper_FreeVecs(stepper);
  return -0x14;
}

Assistant:

int mriStepInnerStepper_AllocVecs(MRIStepInnerStepper stepper, int count,
                                  N_Vector tmpl)
{
  sunindextype lrw1, liw1;

  if (stepper == NULL) return ARK_ILL_INPUT;

  /* Set space requirements for one N_Vector */
  if (tmpl->ops->nvspace) {
    N_VSpace(tmpl, &lrw1, &liw1);
  } else {
    lrw1 = 0;
    liw1 = 0;
  }
  stepper->lrw1 = lrw1;
  stepper->liw1 = liw1;

  /* Set the number of forcing vectors and allocate vectors */
  stepper->nforcing = count;

  if (!arkAllocVecArray(count,
                        tmpl, &(stepper->forcing),
                        stepper->lrw1, &(stepper->lrw),
                        stepper->liw1, &(stepper->liw))) {
    mriStepInnerStepper_FreeVecs(stepper);
    return(ARK_MEM_FAIL);
  }

  /* Allocate fused operation workspace arrays */
  if (stepper->vecs == NULL) {
    stepper->vecs = (N_Vector *) calloc(count + 1, sizeof(N_Vector));
    if (stepper->vecs == NULL) {
      mriStepInnerStepper_FreeVecs(stepper);
      return(ARK_MEM_FAIL);
    }
  }

  if (stepper->vals == NULL) {
    stepper->vals = (realtype *) calloc(count + 1, sizeof(realtype));
    if (stepper->vals == NULL) {
      mriStepInnerStepper_FreeVecs(stepper);
      return(ARK_MEM_FAIL);
    }
  }

  return(ARK_SUCCESS);
}